

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbglxnativeinterfacehandler.cpp
# Opt level: O1

NativeResourceForContextFunction __thiscall
QXcbGlxNativeInterfaceHandler::nativeResourceFunctionForContext
          (QXcbGlxNativeInterfaceHandler *this,QByteArray *resource)

{
  bool bVar1;
  NativeResourceForContextFunction p_Var2;
  code *pcVar3;
  QByteArray *rhs;
  size_t i;
  long lVar4;
  
  if (resourceType(QByteArray_const&)::names == '\0') {
    nativeResourceFunctionForContext();
  }
  rhs = (QByteArray *)&resourceType(QByteArray_const&)::names;
  lVar4 = 0;
  do {
    bVar1 = operator==(resource,rhs);
    if (bVar1) goto LAB_0010d5cc;
    lVar4 = lVar4 + 1;
    rhs = rhs + 1;
  } while (lVar4 == 1);
  lVar4 = 2;
LAB_0010d5cc:
  pcVar3 = (NativeResourceForContextFunction)0x0;
  if ((int)lVar4 == 1) {
    pcVar3 = glxContextForContext;
  }
  p_Var2 = glxConfigForContext;
  if ((int)lVar4 != 0) {
    p_Var2 = pcVar3;
  }
  return p_Var2;
}

Assistant:

QPlatformNativeInterface::NativeResourceForContextFunction QXcbGlxNativeInterfaceHandler::nativeResourceFunctionForContext(const QByteArray &resource) const
{
    switch (resourceType(resource)) {
    case GLXConfig:
        return glxConfigForContext;
    case GLXContext:
        return glxContextForContext;
    default:
        break;
    }
    return nullptr;
}